

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerTest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  TestClass *this;
  RefCount *this_00;
  SmartPtr<Timer> testTimer;
  
  this = (TestClass *)
         operator_new(0x2c0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/timerTest.cpp"
                      ,0x129);
  TestClass::TestClass(this);
  this_00 = (RefCount *)
            operator_new(0x88,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/timerTest.cpp"
                         ,0x12a);
  Timer::Timer((Timer *)this_00,0xa6,true);
  testTimer.mObj = (Timer *)this_00;
  RefCount::AddRef(this_00);
  TestClass::Func1(this);
  TestClass::Func2(this,5,10);
  TestClass::Func3(this,(Timer *)0x0);
  TestClass::Func3(this,testTimer.mObj);
  TestClass::sendPeriodic(this,testTimer.mObj);
  sleep(10);
  Timer::stop();
  SmartPtr<Timer>::operator=(&testTimer,(Timer *)0x0);
  (*(this->super_TimerListener)._vptr_TimerListener[2])(this);
  if (gEventCount != 0) {
    jh_log_print(1,"int main(int, char **)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/timerTest.cpp"
                 ,0x143,"Events leaked %d");
  }
  SmartPtr<Timer>::~SmartPtr(&testTimer);
  return 0;
}

Assistant:

int main( int argc, char*argv[] )
{	
	LOG_NOTICE( "Test Started" );

	TestClass *c = jh_new TestClass;
	SmartPtr<Timer> testTimer = jh_new Timer(166);

	// Initiate test by making back-to-back calls to Func1 and Func2
	c->Func1();
	c->Func2( 5, 10 );
	
	// Send two timed events.  One using default timer, one using
	// a timer with a resolution of 50ms.   Timed event is set to
	// fire after 250ms.   Default timer should actually be ~200
	// and testTimer should be ~250
	c->Func3();
	c->Func3( testTimer );
	
	c->sendPeriodic( testTimer );
	
	// Wait for a while until the test completes
	sleep( 10 );
	
	LOG_NOTICE( "Sleep done" );
	
	testTimer->stop();
	testTimer = NULL;
	delete c;
	
	if ( gEventCount != 0 )
		LOG_ERR_FATAL( "Events leaked %d", gEventCount );

	return 0;
}